

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::ConfigFileNamesAndGenex
          (cmQtAutoGenInitializer *this,ConfigString *configString,string *genex,string_view prefix,
          string_view suffix)

{
  string sStack_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  ConfigFileNames(this,configString,prefix,suffix);
  if (this->MultiConfig == true) {
    local_88.View_._M_len = 10;
    local_88.View_._M_str = "_$<CONFIG>";
    local_58.View_._M_len = prefix._M_len;
    local_58.View_._M_str = prefix._M_str;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (&sStack_a8,&local_58,&local_88,&suffix);
    std::__cxx11::string::operator=((string *)genex,(string *)&sStack_a8);
    std::__cxx11::string::~string((string *)&sStack_a8);
    return;
  }
  std::__cxx11::string::_M_assign((string *)genex);
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNamesAndGenex(
  ConfigString& configString, std::string& genex, cm::string_view const prefix,
  cm::string_view const suffix)
{
  this->ConfigFileNames(configString, prefix, suffix);
  if (this->MultiConfig) {
    genex = cmStrCat(prefix, "_$<CONFIG>"_s, suffix);
  } else {
    genex = configString.Default;
  }
}